

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall
SocketInternals::Open(SocketInternals *this,string *host,string *multicast,unsigned_short port)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  uint32_t IPaddr;
  uint32_t IPaddr_00;
  string local_88;
  string local_58;
  byte local_35;
  undefined4 local_34;
  undefined4 uStack_30;
  uchar firstByte;
  int packetInfo;
  int broadcastEnable;
  unsigned_short port_local;
  string *multicast_local;
  string *host_local;
  SocketInternals *this_local;
  
  (this->ServerAddr).sin_family = 2;
  packetInfo._2_2_ = port;
  _broadcastEnable = multicast;
  multicast_local = host;
  host_local = (string *)this;
  uVar1 = htons(port);
  (this->ServerAddr).sin_port = uVar1;
  uVar2 = EthUdpPort::IP_ULong(multicast_local);
  (this->ServerAddr).sin_addr.s_addr = uVar2;
  iVar3 = socket(2,2,0);
  this->SocketFD = iVar3;
  if (this->SocketFD == -1) {
    poVar4 = std::operator<<(this->outStr,"Failed to open UDP socket");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    uStack_30 = 1;
    local_34 = 1;
    iVar3 = setsockopt(this->SocketFD,1,6,&stack0xffffffffffffffd0,4);
    if (iVar3 == 0) {
      iVar3 = setsockopt(this->SocketFD,0,8,&local_34,4);
      if (iVar3 != 0) {
        poVar4 = std::operator<<(this->outStr,"Open: Failed to set SOCKET packet info option");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      (this->ServerAddrBroadcast).sin_family = 2;
      uVar1 = htons(packetInfo._2_2_);
      (this->ServerAddrBroadcast).sin_port = uVar1;
      local_35 = (byte)(this->ServerAddr).sin_addr.s_addr;
      if (local_35 < 0x80) {
        (this->ServerAddrBroadcast).sin_addr.s_addr =
             (this->ServerAddr).sin_addr.s_addr | 0xffffff00;
      }
      else if (local_35 < 0xc0) {
        (this->ServerAddrBroadcast).sin_addr.s_addr =
             (this->ServerAddr).sin_addr.s_addr | 0xffff0000;
      }
      else if (local_35 < 0xe0) {
        (this->ServerAddrBroadcast).sin_addr.s_addr =
             (this->ServerAddr).sin_addr.s_addr | 0xff000000;
      }
      else {
        (this->ServerAddrBroadcast).sin_addr.s_addr = 0xffffffff;
      }
      (this->ServerAddrMulticast).sin_family = 2;
      uVar1 = htons(packetInfo._2_2_);
      (this->ServerAddrMulticast).sin_port = uVar1;
      uVar2 = EthUdpPort::IP_ULong(_broadcastEnable);
      (this->ServerAddrMulticast).sin_addr.s_addr = uVar2;
      poVar4 = std::operator<<(this->outStr,"Server IP: ");
      poVar4 = std::operator<<(poVar4,(string *)multicast_local);
      poVar4 = std::operator<<(poVar4,", Port: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,packetInfo._2_2_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(this->outStr,"Broadcast IP: ");
      EthUdpPort::IP_String_abi_cxx11_
                (&local_58,(EthUdpPort *)(ulong)(this->ServerAddrBroadcast).sin_addr.s_addr,IPaddr);
      poVar4 = std::operator<<(poVar4,(string *)&local_58);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_58);
      poVar4 = std::operator<<(this->outStr,"Multicast IP: ");
      EthUdpPort::IP_String_abi_cxx11_
                (&local_88,(EthUdpPort *)(ulong)(this->ServerAddrMulticast).sin_addr.s_addr,
                 IPaddr_00);
      poVar4 = std::operator<<(poVar4,(string *)&local_88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_88);
      this_local._7_1_ = true;
    }
    else {
      poVar4 = std::operator<<(this->outStr,"Open: Failed to set SOCKET broadcast option");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SocketInternals::Open(const std::string &host, const std::string &multicast, unsigned short port)
{
#ifdef _MSC_VER
    WSADATA wsaData;
    int retval = WSAStartup(WINSOCKVERSION, &wsaData);
    if (retval != 0) {
        outStr << "WSAStartup failed with error code " << retval << std::endl;
        return false;
    }
#endif
    ServerAddr.sin_family = AF_INET;
    ServerAddr.sin_port = htons(port);
    ServerAddr.sin_addr.s_addr = EthUdpPort::IP_ULong(host);

    // Open UDP socket
    SocketFD = socket(PF_INET, SOCK_DGRAM, 0);
    if (SocketFD == INVALID_SOCKET) {
        outStr << "Failed to open UDP socket" << std::endl;
        return false;
    }

    // Enable broadcasts
#ifdef _MSC_VER
    BOOL broadcastEnable = TRUE;
    DWORD packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<const char *>(&broadcastEnable),
                   sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, reinterpret_cast<const char *>(&packetInfo),
                   sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#else
    int broadcastEnable = 1;
    int packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, &packetInfo, sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#endif

    // Determine the broadcast address. For simplicity, we assume that this is a Class A, B, or C network,
    // as defined by the InterNIC:
    //    Class A: first byte is 0-127, default subnet mask is 255.0.0.0
    //    Class B: first byte is 128-191, default subnet mask is 255.255.0.0
    //    Class C: first byte is 192-223, default subnet mask is 255.255.255.0
    // If the first byte is greater than 223, we use the global broadcast address, 255.255.255.255

    ServerAddrBroadcast.sin_family = AF_INET;
    ServerAddrBroadcast.sin_port = htons(port);
    unsigned char firstByte = static_cast<unsigned char>(ServerAddr.sin_addr.s_addr&0x000000ff);
    if (firstByte < 128)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffffff00;
    else if (firstByte < 192)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffff0000;
    else if (firstByte < 224)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xff000000;
    else
        ServerAddrBroadcast.sin_addr.s_addr = 0xffffffff;

    // UDP Multicast address
    ServerAddrMulticast.sin_family = AF_INET;
    ServerAddrMulticast.sin_port = htons(port);
    ServerAddrMulticast.sin_addr.s_addr = EthUdpPort::IP_ULong(multicast);

    outStr << "Server IP: " << host << ", Port: " << std::dec << port << std::endl;
    outStr << "Broadcast IP: " << EthUdpPort::IP_String(ServerAddrBroadcast.sin_addr.s_addr) << std::endl;
    outStr << "Multicast IP: " << EthUdpPort::IP_String(ServerAddrMulticast.sin_addr.s_addr) << std::endl;
    return true;
}